

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horn.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ssize_t sVar2;
  float fVar3;
  char local_2d8 [8];
  char correct_filename [100];
  char local_268 [8];
  char full_name [100];
  char local_1f8 [8];
  char path3 [100];
  char local_188 [8];
  char path2 [100];
  char local_118 [8];
  char path1 [100];
  uchar local_a8 [8];
  uchar header [32];
  float local_7c;
  float local_78;
  float tau;
  float sigma;
  float max_angle;
  float min_angle;
  float density;
  float st_dev;
  float ave_error;
  int time;
  int numpass;
  int no_bytes;
  int fd_correct;
  int j;
  int i;
  int middle;
  int end;
  int start;
  int size;
  int offset;
  int fdf;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _offset = argv;
  argv_local._0_4_ = argc;
  if ((argc < 7) || (0x13 < argc)) {
    printf("Usage: %s <filename stem> <alpha> <sigma> <central file number> <number of iterations> <input path> <output path> [-S <smooth path> -C <full correct filename> -B <cols> <rows> -T <tau> -H or -MH]\n\n"
           ,*argv);
    printf("<filename stem> - stem of input filenames\n");
    printf("<alpha> - Lagrange multiplier value\n");
    printf("<sigma> - the standard deviation used in smoothing the files\n");
    printf("   sigma==0.0 means no smoothing: use 2 or 5 unsmoothed images\n");
    printf("<central file number> - the image file number for which\n");
    printf("   image velocity is to be computed\n");
    printf("<number of iterations> - number of iterations in the velocity calculation\n");
    printf("<input path> - directory where input data resides\n");
    printf("<output path> - directory where computed flow fields put\n");
    printf("-S <smooth path> - directory where smoothed data is to be put\n");
    printf("   if not present smoothed files are not written\n");
    printf("-B <cols> <rows> - use binary file of size <cols>*<rows> characters\n");
    printf("   instead of black and white rasterfiles as image input\n");
    printf("   image size read from rasterfile header if used\n");
    printf("-C <correct filename> - perform error analysis using correct velocity field\n");
    printf("-T <tau> - threshold the computed velocities on spatial intensity gradient\n");
    printf("-H Standard Horn and Schunck\n");
    printf("   perform H and S differencing on 2 input images\n");
    printf(" sigma is ignored for -H\n");
    printf("-MH Non-standard Horn and Schunck - default\n");
    printf("    perform 4-point central differences on 5 input images\n");
    exit(1);
  }
  printf("\n------------------------------\n");
  printf("Command line: ");
  for (fd_correct = 0; fd_correct < (int)argv_local; fd_correct = fd_correct + 1) {
    printf("%s ",_offset[fd_correct]);
  }
  printf("\n%d arguments\n",(ulong)((int)argv_local - 1));
  __isoc99_sscanf(_offset[2],"%f",&alpha);
  __isoc99_sscanf(_offset[3],"%f",&local_78);
  __isoc99_sscanf(_offset[4],"%d",&j);
  __isoc99_sscanf(_offset[5],"%d",&ave_error);
  printf("alpha=%f\n",(double)alpha);
  printf("sigma=%f\n",(double)local_78);
  printf("Central image: %d\n",(ulong)(uint)j);
  printf("Number of iterations: %d\n",(ulong)(uint)ave_error);
  strcpy(local_118,_offset[6]);
  strcpy(local_188,".");
  strcpy(local_1f8,_offset[7]);
  printf("Input directory: %s\n",local_118);
  printf("Output directory: %s\n",local_1f8);
  BINARY = 0;
  STANDARD = 0;
  THRESHOLD = 0;
  WRITE_SMOOTH = 0;
  fd_correct = 8;
  strcpy(local_2d8,"unknown");
  while (fd_correct < (int)argv_local) {
    iVar1 = strcmp("-H",_offset[fd_correct]);
    if (iVar1 == 0) {
      STANDARD = 1;
      fd_correct = fd_correct + 1;
    }
    else {
      iVar1 = strcmp("-MH",_offset[fd_correct]);
      if (iVar1 == 0) {
        STANDARD = 0;
        fd_correct = fd_correct + 1;
      }
      else {
        iVar1 = strcmp("-C",_offset[fd_correct]);
        if (iVar1 == 0) {
          strcpy(local_2d8,_offset[fd_correct + 1]);
          fd_correct = fd_correct + 2;
        }
        else {
          iVar1 = strcmp("-T",_offset[fd_correct]);
          if (iVar1 == 0) {
            __isoc99_sscanf(_offset[fd_correct + 1],"%f",&local_7c);
            fd_correct = fd_correct + 2;
            THRESHOLD = 1;
          }
          else {
            iVar1 = strcmp("-S",_offset[fd_correct]);
            if (iVar1 == 0) {
              strcpy(local_188,_offset[fd_correct + 1]);
              WRITE_SMOOTH = 1;
              fd_correct = fd_correct + 2;
            }
            else {
              iVar1 = strcmp("-B",_offset[fd_correct]);
              if (iVar1 != 0) {
                printf("Invalid option %s specified as argument %d -  program terminates\n",
                       _offset[fd_correct],(ulong)(uint)fd_correct);
                exit(1);
              }
              __isoc99_sscanf(_offset[fd_correct + 1],"%d",&pic_y);
              __isoc99_sscanf(_offset[fd_correct + 2],"%d",&pic_x);
              BINARY = 1;
              fd_correct = fd_correct + 3;
            }
          }
        }
      }
    }
  }
  if (WRITE_SMOOTH == 0) {
    printf("Smoothed images not written\n");
  }
  else {
    printf("Smoothed data directory: %s\n",local_188);
  }
  fflush(_stdout);
  printf("Correct velocity file: %s\n",local_2d8);
  fflush(_stdout);
  iVar1 = strcmp(local_2d8,"unknown");
  if (iVar1 == 0) {
LAB_00101aab:
    if (STANDARD == 0) {
      end = (int)(local_78 * 6.0 + 1.0);
      if (end % 2 == 0) {
        end = end + 1;
      }
      start = end / 2 + 2;
      middle = j - start;
      i = j + start;
      printf("Size: %d Offset: %d Start: %d End: %d\n",(ulong)(uint)end,(ulong)(uint)start,
             (ulong)(uint)middle,(ulong)(uint)i);
      printf("%d images required\n",(ulong)((i - middle) + 1));
      if (0xf < (i - middle) + 1) {
        printf("Fatal error: not enough room for the images\n");
        exit(1);
      }
      if (i < middle) {
        printf("Fatal error: specify images in ascending order\n");
        exit(1);
      }
      read_and_smooth3D(local_118,_offset[1],SUB84((double)local_78,0),floatpic,pic,inpic,middle,j,i
                        ,local_a8);
      if (((local_78 != 0.0) || (NAN(local_78))) && (WRITE_SMOOTH != 0)) {
        writefiles(local_188,_offset[1],pic,SUB84((double)local_78,0),pic_t,pic_x,pic_y,j + -2,j + 2
                   ,local_a8);
      }
    }
    else {
      middle = j;
      i = j + 1;
      start = 2;
      readfiles(local_118,_offset[1],inpic,pic_t,&pic_x,&pic_y,j,i,local_a8);
      for (fd_correct = 0; fd_correct < pic_x; fd_correct = fd_correct + 1) {
        for (no_bytes = 0; no_bytes < pic_y; no_bytes = no_bytes + 1) {
          pic[0][fd_correct][no_bytes] = inpic[0][fd_correct][no_bytes];
          *(undefined1 *)((long)fd_correct * 0x2a3 + 0xda2ec9 + (long)no_bytes) =
               *(undefined1 *)((long)fd_correct * 0x2a3 + 0xfcf1b9 + (long)no_bytes);
          *(undefined1 *)((long)fd_correct * 0x2a3 + 0xe12292 + (long)no_bytes) = 0;
          *(undefined1 *)((long)fd_correct * 0x2a3 + 0xe8165b + (long)no_bytes) = 0;
          *(undefined1 *)((long)fd_correct * 0x2a3 + 0xef0a24 + (long)no_bytes) = 0;
          floatpic[0][fd_correct][no_bytes] = (float)inpic[0][fd_correct][no_bytes];
          *(float *)((long)fd_correct * 0xa8c + 0x63fe64 + (long)no_bytes * 4) =
               (float)*(byte *)((long)fd_correct * 0x2a3 + 0xfcf1b9 + (long)no_bytes);
          *(undefined4 *)((long)fd_correct * 0xa8c + 0x7fcd88 + (long)no_bytes * 4) = 0;
          *(undefined4 *)((long)fd_correct * 0xa8c + 0x9b9cac + (long)no_bytes * 4) = 0;
          *(undefined4 *)((long)fd_correct * 0xa8c + 0xb76bd0 + (long)no_bytes * 4) = 0;
        }
      }
    }
    printf("Number of Columns: %d Number of Rows: %d\n",(ulong)(uint)pic_y,(ulong)(uint)pic_x);
    if ((pic_x < 0x2a4) && (pic_y < 0x2a4)) {
      printf("\n");
      fflush(_stdout);
      if (STANDARD == 1) {
        if (THRESHOLD == 0) {
          sprintf(local_268,"%s/horn.original.%sF",local_1f8,_offset[1]);
        }
        else {
          sprintf(local_268,"%s/horn.original.%sF-%4.2f",(double)local_7c,local_1f8,_offset[1]);
        }
      }
      else if (THRESHOLD == 0) {
        sprintf(local_268,"%s/horn.modified.%sF",local_1f8,_offset[1]);
      }
      else {
        sprintf(local_268,"%s/horn.modified.%sF-%4.2f",(double)local_7c,local_1f8,_offset[1]);
      }
      printf("Output full velocities go to file %s\n",local_268);
      printf("\n");
      fflush(_stdout);
      startx = 2;
      starty = 2;
      endx = pic_x + -3;
      endy = pic_y + -3;
      step = 1;
      st_dev = 0.0;
      if (STANDARD == 0) {
        compute_ders(Ix,Iy,It,floatpic,pic_t,pic_x,pic_y,start);
      }
      else {
        calcIx(Ix,floatpic,0);
        calcIy(Iy,floatpic,(int)st_dev);
        calcIt(It,floatpic,(int)st_dev);
      }
      for (fd_correct = 0; fd_correct < 0x2a3; fd_correct = fd_correct + 1) {
        for (no_bytes = 0; no_bytes < 0x2a3; no_bytes = no_bytes + 1) {
          *(undefined4 *)((long)fd_correct * 0x1518 + 0x1b1b464 + (long)no_bytes * 8) = 0;
          full_vels[fd_correct][no_bytes][0] = 0.0;
          *(undefined4 *)((long)fd_correct * 0x1518 + 0x1e952b4 + (long)no_bytes * 8) = 0;
          full_vels1[fd_correct][no_bytes][0] = 0.0;
        }
      }
      for (fd_correct = 0; fd_correct < (int)ave_error; fd_correct = fd_correct + 2) {
        printf("%3dth iteration\n",(ulong)(uint)fd_correct);
        fflush(_stdout);
        calc_vels(full_vels,full_vels1,Ix,Iy,It);
        fVar3 = difference(full_vels,full_vels1,pic_x,pic_y);
        printf("The improvement: %f\n",(double)fVar3);
        fflush(_stdout);
        iVar1 = strcmp(local_2d8,"unknown");
        if (iVar1 != 0) {
          rearrange(full_vels1,temp_vels);
          calc_statistics(correct_vels,int_size_x,int_size_y,temp_vels,pic_x,pic_y,start << 1,
                          &density,&min_angle,&max_angle,&sigma,&tau);
          printf("Error: %f St Dev: %f Density: %f\n",(double)density,(double)min_angle,
                 (double)max_angle);
          fflush(_stdout);
        }
        printf("%3dth iteration\n",(ulong)(fd_correct + 1));
        calc_vels(full_vels1,full_vels,Ix,Iy,It);
        fVar3 = difference(full_vels,full_vels1,pic_x,pic_y);
        printf("The improvement: %f\n",(double)fVar3);
        iVar1 = strcmp(local_2d8,"unknown");
        if (iVar1 != 0) {
          rearrange(full_vels,temp_vels);
          calc_statistics(correct_vels,int_size_x,int_size_y,temp_vels,pic_x,pic_y,start << 1,
                          &density,&min_angle,&max_angle,&sigma,&tau);
          printf("Error: %f St Dev: %f Density: %f\n",(double)density,(double)min_angle,
                 (double)max_angle);
          fflush(_stdout);
        }
      }
      if (THRESHOLD != 0) {
        threshold(full_vels,Ix,Iy,SUB84((double)local_7c,0),pic_x,pic_y);
      }
      size = creat(local_268,0x1a4);
      if (size < 1) {
        printf("Error in opening %s file\n\n",local_268);
      }
      else {
        output_velocities(size,"Full",full_vels,pic_x,pic_y,start << 1);
      }
      printf("\nVelocities computed and output\n");
      fflush(_stdout);
      iVar1 = strcmp(local_2d8,"unknown");
      if (iVar1 != 0) {
        calc_statistics(correct_vels,int_size_x,int_size_y,full_vels,pic_x,pic_y,start << 1,&density
                        ,&min_angle,&max_angle,&sigma,&tau);
        printf("\n\nComputed Statistics\n");
        printf("Error: %f St Dev: %f\n",(double)density,(double)min_angle);
        printf("Density: %f\n",(double)max_angle);
        printf("Minimum angle error: %f Maximum angle error: %f\n",(double)sigma,(double)tau);
      }
      fflush(_stdout);
      return 0;
    }
    printf("Fatal error: images are too big\n");
    exit(1);
  }
  numpass = open(local_2d8,0);
  if (numpass < 1) {
    printf("Fatal error in opening file %s\n",local_2d8);
    printf("fd_correct: %d\n",(ulong)(uint)numpass);
    exit(1);
  }
  time = 0;
  sVar2 = read(numpass,&actual_y,4);
  time = time + (int)sVar2;
  sVar2 = read(numpass,&actual_x,4);
  time = time + (int)sVar2;
  sVar2 = read(numpass,&size_y,4);
  time = time + (int)sVar2;
  sVar2 = read(numpass,&size_x,4);
  time = time + (int)sVar2;
  sVar2 = read(numpass,&offset_y,4);
  time = time + (int)sVar2;
  sVar2 = read(numpass,&offset_x,4);
  time = time + (int)sVar2;
  if ((((offset_x == 0.0) && (!NAN(offset_x))) && (offset_y == 0.0)) && (!NAN(offset_y))) {
    if ((actual_x == size_x) && (!NAN(actual_x) && !NAN(size_x))) {
      if ((actual_y == size_y) && (!NAN(actual_y) && !NAN(size_y))) {
        int_size_y = (int)size_y;
        int_size_x = (int)size_x;
        for (fd_correct = 0; fd_correct < int_size_x; fd_correct = fd_correct + 1) {
          sVar2 = read(numpass,correct_vels + fd_correct,(long)(int_size_y << 3));
          time = time + (int)sVar2;
        }
        printf("\nFile %s opened and read\n",local_2d8);
        printf("Size of correct velocity data: %d %d\n",(ulong)(uint)int_size_y,
               (ulong)(uint)int_size_x);
        printf("%d bytes read\n",(ulong)(uint)time);
        fflush(_stdout);
        goto LAB_00101aab;
      }
    }
  }
  printf("Fatal error: something wrong with correct velocity data\n");
  printf("Actual y: %f Actual x: %f\n",(double)actual_y,(double)actual_x);
  printf("Size y: %f Size x: %f\n",(double)size_y,(double)size_x);
  printf("Offset y: %f Offset x: %f\n",(double)offset_y,(double)offset_x);
  exit(1);
}

Assistant:

int main(argc,argv)
int argc;
char **argv;
{
int fdf,offset,size,start,end,middle,i,j;
int fd_correct,no_bytes,numpass,time;
float ave_error,st_dev,density,min_angle,max_angle,sigma,tau;
unsigned char header[HEAD];
char path1[100],path2[100],path3[100];
char full_name[100],correct_filename[100];

if(argc < 7 || argc > 19)
	{
        printf("Usage: %s <filename stem> <alpha> <sigma> <central file number> <number of iterations> <input path> <output path> [-S <smooth path> -C <full correct filename> -B <cols> <rows> -T <tau> -H or -MH]\n\n",argv[0]);
	printf("<filename stem> - stem of input filenames\n");
	printf("<alpha> - Lagrange multiplier value\n");
	printf("<sigma> - the standard deviation used in smoothing the files\n");
	printf("   sigma==0.0 means no smoothing: use 2 or 5 unsmoothed images\n");
	printf("<central file number> - the image file number for which\n");
	printf("   image velocity is to be computed\n");
	printf("<number of iterations> - number of iterations in the velocity calculation\n");
	printf("<input path> - directory where input data resides\n");
	printf("<output path> - directory where computed flow fields put\n");
	printf("-S <smooth path> - directory where smoothed data is to be put\n");
	printf("   if not present smoothed files are not written\n");
	printf("-B <cols> <rows> - use binary file of size <cols>*<rows> characters\n");
	printf("   instead of black and white rasterfiles as image input\n");
	printf("   image size read from rasterfile header if used\n");
	printf("-C <correct filename> - perform error analysis using correct velocity field\n");
	printf("-T <tau> - threshold the computed velocities on spatial intensity gradient\n");
	printf("-H Standard Horn and Schunck\n");
	printf("   perform H and S differencing on 2 input images\n");
	printf(" sigma is ignored for -H\n");
	printf("-MH Non-standard Horn and Schunck - default\n");
	printf("    perform 4-point central differences on 5 input images\n");
	exit(1);
        }

printf("\n------------------------------\n");
printf("Command line: ");
for(i=0;i<argc;i++) printf("%s ",argv[i]);
printf("\n%d arguments\n",argc-1);

sscanf(argv[2],"%f",&alpha);
sscanf(argv[3],"%f",&sigma);
sscanf(argv[4],"%d",&middle);
sscanf(argv[5],"%d",&numpass);
printf("alpha=%f\n",alpha);
printf("sigma=%f\n",sigma);
printf("Central image: %d\n",middle);
printf("Number of iterations: %d\n",numpass);
strcpy(path1,argv[6]);
strcpy(path2,".");
strcpy(path3,argv[7]);

printf("Input directory: %s\n",path1);
printf("Output directory: %s\n",path3);

BINARY = FALSE;
STANDARD = FALSE;
THRESHOLD = FALSE;
WRITE_SMOOTH = FALSE;
i=8;
strcpy(correct_filename,"unknown");
while(i<argc)
{
if(strcmp("-H",argv[i])==0)
	{
	STANDARD = TRUE;
	i++;
	}
else
if(strcmp("-MH",argv[i])==0)
	{
	STANDARD = FALSE;
	i++;
	}
else
if(strcmp("-C",argv[i])==0)
	{
	strcpy(correct_filename,argv[i+1]);
	i+=2;
	}
else
if(strcmp("-T",argv[i])==0)
	{
	sscanf(argv[i+1],"%f",&tau);
	i+=2;
	THRESHOLD = TRUE;
	}
else
if(strcmp("-S",argv[i])==0)
	{
	strcpy(path2,argv[i+1]);
	WRITE_SMOOTH = TRUE;
	i+=2;
	}
else
if(strcmp("-B",argv[i])==0)
	{
	sscanf(argv[i+1],"%d",&pic_y);
	sscanf(argv[i+2],"%d",&pic_x);
	BINARY = TRUE;
	i += 3;
	}
else
	{
	printf("Invalid option %s specified as argument %d -  program terminates\n",argv[i],i);
	exit(1);
	}
}

if(WRITE_SMOOTH) printf("Smoothed data directory: %s\n",path2);
else printf("Smoothed images not written\n");
fflush(stdout);

printf("Correct velocity file: %s\n",correct_filename);
fflush(stdout);
if(strcmp(correct_filename,"unknown")!=0)
{
/* Read the correct velocity data */
if((fd_correct = open(correct_filename,O_RDONLY))<1)
	{
	printf("Fatal error in opening file %s\n",correct_filename);
	printf("fd_correct: %d\n",fd_correct);
	exit(1);
	}
no_bytes = 0;
no_bytes += read(fd_correct,&actual_y,4);
no_bytes += read(fd_correct,&actual_x,4);
no_bytes += read(fd_correct,&size_y,4);
no_bytes += read(fd_correct,&size_x,4);
no_bytes += read(fd_correct,&offset_y,4);
no_bytes += read(fd_correct,&offset_x,4);
if(offset_x != 0.0 || offset_y != 0.0 || actual_x != size_x || actual_y != size_y)
	{
	printf("Fatal error: something wrong with correct velocity data\n");
	printf("Actual y: %f Actual x: %f\n",actual_y,actual_x);
	printf("Size y: %f Size x: %f\n",size_y,size_x);
	printf("Offset y: %f Offset x: %f\n",offset_y,offset_x);
	exit(1);
	}
int_size_y = size_y;
int_size_x = size_x;
for(i=0;i<int_size_x;i++)
	no_bytes += read(fd_correct,&correct_vels[i][0][0],int_size_y*8);
printf("\nFile %s opened and read\n",correct_filename);
printf("Size of correct velocity data: %d %d\n",int_size_y,int_size_x);
printf("%d bytes read\n",no_bytes);
fflush(stdout);
}

if(!STANDARD)
{
size = 6*sigma+1;
if(size%2==0) size = size+1;
offset = size/2+2; /* Add 2 as neighbourhood size offset */
start = middle-offset;
end = middle+offset;
printf("Size: %d Offset: %d Start: %d End: %d\n",size,offset,start,end);
printf("%d images required\n",end-start+1);
if((end-start+1) > PIC_T)
	{
	printf("Fatal error: not enough room for the images\n");
	exit(1);
	}
if(end < start)
	{
	printf("Fatal error: specify images in ascending order\n");
	exit(1);
	}

read_and_smooth3D(path1,argv[1],sigma,floatpic,pic,inpic,start,middle,end,header);
if(sigma!=0.0 && WRITE_SMOOTH)
writefiles(path2,argv[1],pic,sigma,pic_t,pic_x,pic_y,middle-2,middle+2,header);
}
else
{
start = middle;
end = middle+1;
offset = 2;
readfiles(path1,argv[1],inpic,pic_t,&pic_x,&pic_y,start,end,header);
/* Copy the input images unchanged */
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	{
	pic[0][i][j] = inpic[0][i][j];
	pic[1][i][j] = inpic[1][i][j];
	pic[2][i][j] = 0;
	pic[3][i][j] = 0;
	pic[4][i][j] = 0;
	floatpic[0][i][j] = (int) inpic[0][i][j];
	floatpic[1][i][j] = (int) inpic[1][i][j];
	floatpic[2][i][j] = 0.0;
	floatpic[3][i][j] = 0.0;
	floatpic[4][i][j] = 0.0;
	}
}

printf("Number of Columns: %d Number of Rows: %d\n",pic_y,pic_x);
if(pic_x > PIC_X || pic_y > PIC_Y)
	{
	printf("Fatal error: images are too big\n");
	exit(1);
	}

printf("\n");
fflush(stdout);
if(STANDARD==TRUE)
{
if(THRESHOLD) sprintf(full_name,"%s/horn.original.%sF-%4.2f",path3,argv[1],tau);
else sprintf(full_name,"%s/horn.original.%sF",path3,argv[1]);
}
else
{
if(THRESHOLD) sprintf(full_name,"%s/horn.modified.%sF-%4.2f",path3,argv[1],tau);
else sprintf(full_name,"%s/horn.modified.%sF",path3,argv[1]);
}

printf("Output full velocities go to file %s\n",full_name);
printf("\n");
fflush(stdout);

startx = 0;
starty = 0;
endx = pic_x-1;
endy = pic_y-1;

startx += BORDER;
starty += BORDER;
endx -= BORDER;
endy -= BORDER;

step = 1;

time = 0;
if(STANDARD)
	{
	calcIx(Ix,floatpic,time);
	calcIy(Iy,floatpic,time);
	calcIt(It,floatpic,time);
	}
else compute_ders(Ix,Iy,It,floatpic,pic_t,pic_x,pic_y,offset);
if(FALSE)
{
if(STANDARD) printf("Standard Horn and Schunck Derivatives\n");
else printf("4 point central difference derivatives\n");
print_ders(Ix,Iy,It);
}

for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	{
	full_vels[i][j][0] = full_vels[i][j][1] = 0.0;
	full_vels1[i][j][0] = full_vels1[i][j][1] = 0.0;
	}

/* Perform iterations */
for(i=0;i<numpass;i+=2)
	{
	printf("%3dth iteration\n",i);
	fflush(stdout);
	calc_vels(full_vels,full_vels1,Ix,Iy,It);
	printf("The improvement: %f\n",difference(full_vels,full_vels1,pic_x,pic_y));
	fflush(stdout);
if(strcmp(correct_filename,"unknown")!=0)
	{
	rearrange(full_vels1,temp_vels);
	calc_statistics(correct_vels,int_size_x,int_size_y,temp_vels,
     		pic_x,pic_y,2*offset,&ave_error,&st_dev,&density,&min_angle,&max_angle);
	printf("Error: %f St Dev: %f Density: %f\n",ave_error,st_dev,density);
	fflush(stdout);
	}
	printf("%3dth iteration\n",i+1);
	calc_vels(full_vels1,full_vels,Ix,Iy,It);
	printf("The improvement: %f\n",difference(full_vels,full_vels1,pic_x,pic_y));
if(strcmp(correct_filename,"unknown")!=0)
	{
	rearrange(full_vels,temp_vels);
	calc_statistics(correct_vels,int_size_x,int_size_y,temp_vels,
     		pic_x,pic_y,2*offset,&ave_error,&st_dev,&density,&min_angle,&max_angle);
	printf("Error: %f St Dev: %f Density: %f\n",ave_error,st_dev,density);
	fflush(stdout);
	}
	}
if(THRESHOLD) threshold(full_vels,Ix,Iy,tau,pic_x,pic_y);

if((fdf=creat(full_name,0644))>0)
	output_velocities(fdf,"Full",full_vels,pic_x,pic_y,2*offset);
else printf("Error in opening %s file\n\n",full_name);
printf("\nVelocities computed and output\n");
fflush(stdout);

if(strcmp(correct_filename,"unknown")!=0)
{
calc_statistics(correct_vels,int_size_x,int_size_y,full_vels,
     pic_x,pic_y,2*offset,&ave_error,&st_dev,&density,&min_angle,&max_angle);
printf("\n\nComputed Statistics\n");
printf("Error: %f St Dev: %f\n",ave_error,st_dev);
printf("Density: %f\n",density);
printf("Minimum angle error: %f Maximum angle error: %f\n",min_angle,max_angle);
}
fflush(stdout);
return EXIT_SUCCESS;
}